

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3Update(Parse *pParse,SrcList *pTabList,ExprList *pChanges,Expr *pWhere,int onError)

{
  Index **ppIVar1;
  byte bVar2;
  u8 uVar3;
  uint uVar4;
  int iCur;
  sqlite3 *db;
  ExprList_item *pEVar5;
  Column *pCVar6;
  bool bVar7;
  Select *pSVar8;
  bool bVar9;
  short sVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  u32 uVar16;
  u32 uVar17;
  Table *pTab;
  Trigger *pTrigger;
  int *aChange;
  Index *pIVar18;
  Vdbe *p;
  WhereInfo *pWInfo;
  Index *pIVar19;
  KeyInfo *zP4;
  int iVar20;
  char *zArg2;
  Schema **ppSVar21;
  int iVar22;
  byte *pbVar23;
  byte *pbVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  int *piVar28;
  byte *z;
  long lVar29;
  bool bVar30;
  int local_10c;
  int *local_f8;
  Expr *local_c8;
  int local_a8;
  int tmask;
  Expr *local_a0;
  Select *local_98;
  int local_8c;
  ulong local_88;
  ulong local_80;
  char *local_78;
  Parse *local_70;
  NameContext local_68;
  
  db = pParse->db;
  if (((pParse->nErr != 0) || (db->mallocFailed != '\0')) ||
     (pTab = sqlite3SrcListLookup(pParse,pTabList), pTab == (Table *)0x0)) {
    local_f8 = (int *)0x0;
    aChange = (int *)0x0;
    goto LAB_0017cadc;
  }
  if (pTab->pSchema == (Schema *)0x0) {
    uVar27 = 0xfff0bdc0;
  }
  else {
    uVar4 = pParse->db->nDb;
    if ((int)uVar4 < 1) {
      uVar27 = 0;
    }
    else {
      ppSVar21 = &pParse->db->aDb->pSchema;
      uVar27 = 0;
      do {
        if (*ppSVar21 == pTab->pSchema) goto LAB_0017cb82;
        uVar27 = uVar27 + 1;
        ppSVar21 = ppSVar21 + 4;
      } while (uVar4 != uVar27);
      uVar27 = (ulong)uVar4;
    }
  }
LAB_0017cb82:
  pTrigger = sqlite3TriggersExist(pParse,pTab,0x6b,pChanges,&tmask);
  local_98 = pTab->pSelect;
  iVar11 = sqlite3ViewGetColumnNames(pParse,pTab);
  if (((iVar11 != 0) || (iVar11 = sqlite3IsReadOnly(pParse,pTab,tmask), iVar11 != 0)) ||
     (aChange = (int *)sqlite3DbMallocRaw(db,(int)pTab->nCol << 2), aChange == (int *)0x0)) {
    local_f8 = (int *)0x0;
    aChange = (int *)0x0;
    goto LAB_0017cadc;
  }
  if (0 < (long)pTab->nCol) {
    memset(aChange,0xff,(long)pTab->nCol << 2);
  }
  iCur = pParse->nTab;
  iVar11 = iCur + 1;
  pParse->nTab = iVar11;
  pTabList->a[0].iCursor = iCur;
  pIVar18 = pTab->pIndex;
  iVar20 = iVar11;
  if (pIVar18 != (Index *)0x0) {
    do {
      iVar20 = iVar20 + 1;
      pIVar18 = pIVar18->pNext;
    } while (pIVar18 != (Index *)0x0);
    pParse->nTab = iVar20;
  }
  local_68.pNext = (NameContext *)0x0;
  local_68.nRef = 0;
  local_68.nErr = 0;
  local_68.pEList = (ExprList *)0x0;
  local_68.pAggInfo = (AggInfo *)0x0;
  local_68.ncFlags = '\0';
  local_68._49_7_ = 0;
  iVar20 = (int)uVar27;
  local_a0 = pWhere;
  local_68.pParse = pParse;
  local_68.pSrcList = pTabList;
  if (pChanges->nExpr < 1) {
    local_c8 = (Expr *)0x0;
    local_10c = 0;
  }
  else {
    lVar29 = 0;
    local_10c = 0;
    local_c8 = (Expr *)0x0;
    do {
      iVar12 = sqlite3ResolveExprNames(&local_68,pChanges->a[lVar29].pExpr);
      if (iVar12 != 0) {
        local_f8 = (int *)0x0;
        pWhere = local_a0;
        goto LAB_0017cadc;
      }
      pEVar5 = pChanges->a;
      if ((long)pTab->nCol < 1) {
        z = (byte *)pEVar5[lVar29].zName;
      }
      else {
        pCVar6 = pTab->aCol;
        z = (byte *)pEVar5[lVar29].zName;
        uVar27 = 0;
        do {
          pbVar24 = (byte *)pCVar6[uVar27].zName;
          bVar2 = *pbVar24;
          pbVar23 = z;
          while (bVar2 != 0) {
            uVar26 = (ulong)bVar2;
            pbVar24 = pbVar24 + 1;
            if (""[uVar26] != ""[*pbVar23]) goto LAB_0017cd56;
            pbVar23 = pbVar23 + 1;
            bVar2 = *pbVar24;
          }
          uVar26 = 0;
LAB_0017cd56:
          if (""[uVar26] == ""[*pbVar23]) {
            if (uVar27 == (long)pTab->iPKey) {
              local_c8 = pEVar5[lVar29].pExpr;
              local_10c = 1;
            }
            aChange[uVar27] = (int)lVar29;
            uVar27 = uVar27 & 0xffffffff;
            zArg2 = pCVar6[uVar27].zName;
            goto LAB_0017cdf1;
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != (long)pTab->nCol);
      }
      iVar12 = sqlite3IsRowid((char *)z);
      if (iVar12 == 0) {
        sqlite3ErrorMsg(pParse,"no such column: %s",z);
        pParse->checkSchema = '\x01';
LAB_0017d0ab:
        local_f8 = (int *)0x0;
        pWhere = local_a0;
        goto LAB_0017cadc;
      }
      local_c8 = pEVar5[lVar29].pExpr;
      local_10c = 1;
      uVar27 = 0xffffffffffffffff;
      zArg2 = "ROWID";
LAB_0017cdf1:
      iVar12 = sqlite3AuthCheck(pParse,0x17,pTab->zName,zArg2,db->aDb[iVar20].zName);
      if (iVar12 == 2) {
        aChange[uVar27] = -1;
      }
      else if (iVar12 == 1) goto LAB_0017d0ab;
      lVar29 = lVar29 + 1;
    } while (lVar29 < pChanges->nExpr);
  }
  iVar12 = sqlite3FkRequired((Parse *)(ulong)(uint)pParse->db->flags,pTab,aChange,local_10c);
  pWhere = local_a0;
  pIVar18 = pTab->pIndex;
  iVar22 = 0;
  if (pIVar18 == (Index *)0x0) {
    local_f8 = (int *)0x0;
  }
  else {
    do {
      pIVar18 = pIVar18->pNext;
      iVar22 = iVar22 + 8;
    } while (pIVar18 != (Index *)0x0);
    local_f8 = (int *)sqlite3DbMallocRaw(db,iVar22);
    if (local_f8 == (int *)0x0) {
      local_f8 = (int *)0x0;
      goto LAB_0017cadc;
    }
    pIVar18 = pTab->pIndex;
    if (pIVar18 != (Index *)0x0) {
      lVar29 = 0;
      do {
        if (iVar12 == 0 && local_10c == 0) {
          iVar22 = 0;
          if ((ulong)pIVar18->nColumn != 0) {
            uVar27 = 0;
            do {
              if (-1 < aChange[pIVar18->aiColumn[uVar27]]) goto LAB_0017ced6;
              uVar27 = uVar27 + 1;
            } while (pIVar18->nColumn != uVar27);
          }
        }
        else {
LAB_0017ced6:
          iVar22 = pParse->nMem + 1;
          pParse->nMem = iVar22;
        }
        local_f8[lVar29] = iVar22;
        lVar29 = lVar29 + 1;
        pIVar18 = pIVar18->pNext;
      } while (pIVar18 != (Index *)0x0);
    }
  }
  p = sqlite3GetVdbe(pParse);
  if (p == (Vdbe *)0x0) goto LAB_0017cadc;
  if (pParse->nested == '\0') {
    p->field_0x9a = p->field_0x9a | 0x10;
  }
  sqlite3BeginWriteOperation(pParse,1,iVar20);
  if ((pTab->tabFlags & 0x10) != 0) {
    updateVirtualTable(pParse,pTabList,pTab,pChanges,local_c8,aChange,pWhere,onError);
    pTabList = (SrcList *)0x0;
    pWhere = (Expr *)0x0;
    goto LAB_0017cadc;
  }
  iVar22 = pParse->nMem;
  uVar4 = iVar22 + 2;
  if ((pTrigger != (Trigger *)0x0) || (local_8c = 0, uVar25 = uVar4, iVar12 != 0)) {
    local_8c = iVar22 + 3;
    uVar25 = (int)pTab->nCol + uVar4;
  }
  uVar15 = uVar25;
  if ((local_10c != 0 || pTrigger != (Trigger *)0x0) || iVar12 != 0) {
    uVar15 = uVar25 + 1;
  }
  local_80 = (ulong)uVar15;
  uVar25 = uVar25 + 1;
  if ((local_10c == 0 && pTrigger == (Trigger *)0x0) && iVar12 == 0) {
    uVar25 = uVar4;
  }
  pParse->nMem = (int)pTab->nCol + uVar15;
  if (local_98 == (Select *)0x0) {
    local_78 = (char *)0x0;
    local_70 = (Parse *)0x0;
  }
  else {
    local_78 = pParse->zAuthContext;
    pParse->zAuthContext = pTab->zName;
    sqlite3MaterializeView(pParse,pTab,pWhere,iCur);
    local_70 = pParse;
  }
  iVar13 = sqlite3ResolveExprNames(&local_68,pWhere);
  if (iVar13 == 0) {
    local_88 = (ulong)(iVar22 + 1U);
    sqlite3VdbeAddOp3(p,10,0,iVar22 + 1U,uVar4);
    pWInfo = sqlite3WhereBegin(pParse,pTabList,pWhere,(ExprList *)0x0,(ExprList *)0x0,4,0);
    if (pWInfo != (WhereInfo *)0x0) {
      uVar3 = pWInfo->okOnePass;
      local_a8 = 0;
      sqlite3VdbeAddOp3(p,0x41,iCur,uVar4,0);
      if (uVar3 == '\0') {
        sqlite3VdbeAddOp3(p,0x70,(int)local_88,uVar4,0);
      }
      sqlite3WhereEnd(pWInfo);
      pSVar8 = local_98;
      if (((db->flags & 0x10) != 0) && (pParse->pTriggerTab == (Table *)0x0)) {
        local_a8 = pParse->nMem + 1;
        pParse->nMem = local_a8;
        sqlite3VdbeAddOp3(p,7,0,local_a8,0);
      }
      bVar30 = false;
      if (pSVar8 == (Select *)0x0) {
        if (uVar3 == '\0') {
          sqlite3OpenTable(pParse,iCur,iVar20,pTab,0x28);
        }
        bVar30 = false;
        pIVar18 = pTab->pIndex;
        piVar28 = local_f8;
        bVar9 = true;
        bVar7 = bVar30;
        if (onError != 5) {
          pIVar19 = pIVar18;
          if (pIVar18 == (Index *)0x0) goto LAB_0017d333;
          do {
            bVar30 = pIVar19->onError == '\x05';
            bVar7 = !bVar30;
            if (bVar30) goto joined_r0x0017d2b7;
            ppIVar1 = &pIVar19->pNext;
            pIVar19 = *ppIVar1;
          } while (*ppIVar1 != (Index *)0x0);
          bVar9 = false;
        }
joined_r0x0017d2b7:
        for (; bVar30 = bVar9, pIVar18 != (Index *)0x0; pIVar18 = pIVar18->pNext) {
          if ((!bVar7) || (0 < *piVar28)) {
            zP4 = sqlite3IndexKeyinfo(pParse,pIVar18);
            iVar22 = sqlite3VdbeAddOp3(p,0x28,iVar11,pIVar18->tnum,iVar20);
            sqlite3VdbeChangeP4(p,iVar22,(char *)zP4,-0x10);
          }
          iVar11 = iVar11 + 1;
          piVar28 = piVar28 + 1;
          bVar9 = bVar30;
        }
      }
LAB_0017d333:
      if (uVar3 == '\0') {
        uVar15 = sqlite3VdbeAddOp3(p,0x71,(int)local_88,0,uVar4);
      }
      else {
        uVar14 = sqlite3VdbeAddOp3(p,0x4a,uVar4,0,0);
        uVar15 = sqlite3VdbeAddOp3(p,1,0,0,0);
        if ((-1 < (int)uVar14) && (uVar14 < (uint)p->nOp)) {
          p->aOp[uVar14].p2 = p->nOp;
        }
      }
      sqlite3VdbeAddOp3(p,0x36,iCur,uVar15,uVar4);
      if (local_10c != 0) {
        sqlite3ExprCode(pParse,local_c8,uVar25);
        sqlite3VdbeAddOp3(p,0x15,uVar25,0,0);
      }
      iVar11 = (int)local_80 + 1;
      if ((pTrigger != (Trigger *)0x0) || (iVar12 != 0)) {
        if (iVar12 == 0) {
          uVar16 = 0;
        }
        else {
          uVar16 = sqlite3FkOldmask(pParse,pTab);
        }
        uVar17 = sqlite3TriggerColmask(pParse,pTrigger,pChanges,0,3,pTab,onError);
        iVar20 = local_8c;
        if (0 < pTab->nCol) {
          uVar27 = 0;
          do {
            uVar14 = (uint)uVar27;
            if (((aChange[uVar27] < 0) || ((uVar17 | uVar16) == 0xffffffff)) ||
               ((uVar27 < 0x20 && (((uVar17 | uVar16) >> (uVar14 & 0x1f) & 1) != 0)))) {
              sqlite3ExprCodeGetColumnOfTable(p,pTab,iCur,uVar14,iVar20 + uVar14);
            }
            else {
              sqlite3VdbeAddOp3(p,10,0,iVar20 + uVar14,0);
            }
            uVar27 = uVar27 + 1;
          } while ((long)uVar27 < (long)pTab->nCol);
        }
        if (local_10c == 0) {
          sqlite3VdbeAddOp3(p,0xe,uVar4,uVar25,0);
        }
      }
      uVar16 = sqlite3TriggerColmask(pParse,pTrigger,pChanges,1,1,pTab,onError);
      sqlite3VdbeAddOp3(p,10,0,iVar11,(int)local_80 + (int)pTab->nCol);
      sVar10 = pTab->nCol;
      if (0 < sVar10) {
        uVar27 = 0;
        do {
          if (uVar27 != (uint)(int)pTab->iPKey) {
            uVar14 = (uint)uVar27;
            if ((long)aChange[uVar27] < 0) {
              if (((0x1f < uVar27) || ((tmask & 1U) == 0)) || ((uVar16 >> (uVar14 & 0x1f) & 1) != 0)
                 ) {
                sqlite3VdbeAddOp3(p,0x1d,iCur,uVar14,iVar11 + uVar14);
                sqlite3ColumnDefault(p,pTab,uVar14,iVar11 + uVar14);
              }
            }
            else {
              sqlite3ExprCode(pParse,pChanges->a[aChange[uVar27]].pExpr,iVar11 + uVar14);
            }
          }
          uVar27 = uVar27 + 1;
          sVar10 = pTab->nCol;
        } while ((long)uVar27 < (long)sVar10);
      }
      if ((tmask & 1U) != 0) {
        sqlite3VdbeAddOp3(p,0x1e,iVar11,(int)sVar10,0);
        sqlite3TableAffinityStr(p,pTab);
        sqlite3CodeRowTrigger(pParse,pTrigger,0x6b,pChanges,1,pTab,uVar4,onError,uVar15);
        sqlite3VdbeAddOp3(p,0x36,iCur,uVar15,uVar4);
        sVar10 = pTab->nCol;
        if (0 < sVar10) {
          uVar27 = 0;
          do {
            if ((aChange[uVar27] < 0) && (uVar27 != (uint)(int)pTab->iPKey)) {
              iVar20 = (int)uVar27;
              sqlite3VdbeAddOp3(p,0x1d,iCur,iVar20,iVar11 + iVar20);
              sqlite3ColumnDefault(p,pTab,iVar20,iVar11 + iVar20);
              sVar10 = pTab->nCol;
            }
            uVar27 = uVar27 + 1;
          } while ((long)uVar27 < (long)sVar10);
        }
      }
      if (local_98 == (Select *)0x0) {
        uVar14 = uVar4;
        if (local_10c == 0) {
          uVar14 = 0;
        }
        sqlite3GenerateConstraintChecks
                  (pParse,pTab,iCur,uVar25,local_f8,uVar14,1,onError,uVar15,(int *)0x0);
        if (iVar12 != 0) {
          sqlite3FkCheck(pParse,pTab,uVar4,0);
        }
        uVar14 = sqlite3VdbeAddOp3(p,0x36,iCur,0,uVar4);
        sqlite3GenerateRowIndexDelete(pParse,pTab,iCur,local_f8);
        if (local_10c != 0 || iVar12 != 0) {
          sqlite3VdbeAddOp3(p,0x3b,iCur,0,0);
        }
        if ((-1 < (int)uVar14) && (uVar14 < (uint)p->nOp)) {
          p->aOp[uVar14].p2 = p->nOp;
        }
        if (iVar12 == 0) {
          sqlite3CompleteInsertion(pParse,pTab,iCur,uVar25,local_f8,1,0,0);
        }
        else {
          sqlite3FkCheck(pParse,pTab,0,uVar25);
          sqlite3CompleteInsertion(pParse,pTab,iCur,uVar25,local_f8,1,0,0);
          sqlite3FkActions(pParse,pTab,pChanges,uVar4);
        }
      }
      if (((db->flags & 0x10) != 0) && (pParse->pTriggerTab == (Table *)0x0)) {
        sqlite3VdbeAddOp3(p,0x14,local_a8,1,0);
      }
      sqlite3CodeRowTrigger(pParse,pTrigger,0x6b,pChanges,2,pTab,uVar4,onError,uVar15);
      sqlite3VdbeAddOp3(p,1,0,uVar15,0);
      if ((-1 < (int)uVar15) && (uVar15 < (uint)p->nOp)) {
        p->aOp[uVar15].p2 = p->nOp;
      }
      iVar11 = iCur;
      piVar28 = local_f8;
      for (pIVar18 = pTab->pIndex; pIVar18 != (Index *)0x0; pIVar18 = pIVar18->pNext) {
        iVar11 = iVar11 + 1;
        if ((bVar30) || (0 < *piVar28)) {
          sqlite3VdbeAddOp3(p,0x2d,iVar11,0,0);
        }
        piVar28 = piVar28 + 1;
      }
      sqlite3VdbeAddOp3(p,0x2d,iCur,0,0);
      if ((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) {
        sqlite3AutoincrementEnd(pParse);
      }
      pWhere = local_a0;
      if ((((db->flags & 0x10) != 0) && (pParse->pTriggerTab == (Table *)0x0)) &&
         (pParse->nested == '\0')) {
        sqlite3VdbeAddOp3(p,0x10,local_a8,1,0);
        sqlite3VdbeSetNumCols(p,1);
        if (p->db->mallocFailed == '\0') {
          sqlite3VdbeMemSetStr(p->aColName,"rows updated",-1,'\x01',(_func_void_void_ptr *)0x0);
        }
      }
    }
  }
  if (local_70 != (Parse *)0x0) {
    local_70->zAuthContext = local_78;
  }
LAB_0017cadc:
  sqlite3DbFree(db,local_f8);
  sqlite3DbFree(db,aChange);
  sqlite3SrcListDelete(db,pTabList);
  sqlite3ExprListDelete(db,pChanges);
  sqlite3ExprDelete(db,pWhere);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Update(
  Parse *pParse,         /* The parser context */
  SrcList *pTabList,     /* The table in which we should change things */
  ExprList *pChanges,    /* Things to be changed */
  Expr *pWhere,          /* The WHERE clause.  May be null */
  int onError            /* How to handle constraint errors */
){
  int i, j;              /* Loop counters */
  Table *pTab;           /* The table to be updated */
  int addr = 0;          /* VDBE instruction address of the start of the loop */
  WhereInfo *pWInfo;     /* Information about the WHERE clause */
  Vdbe *v;               /* The virtual database engine */
  Index *pIdx;           /* For looping over indices */
  int nIdx;              /* Number of indices that need updating */
  int iCur;              /* VDBE Cursor number of pTab */
  sqlite3 *db;           /* The database structure */
  int *aRegIdx = 0;      /* One register assigned to each index to be updated */
  int *aXRef = 0;        /* aXRef[i] is the index in pChanges->a[] of the
                         ** an expression for the i-th column of the table.
                         ** aXRef[i]==-1 if the i-th column is not changed. */
  int chngRowid;         /* True if the record number is being changed */
  Expr *pRowidExpr = 0;  /* Expression defining the new record number */
  int openAll = 0;       /* True if all indices need to be opened */
  AuthContext sContext;  /* The authorization context */
  NameContext sNC;       /* The name-context to resolve expressions in */
  int iDb;               /* Database containing the table being updated */
  int okOnePass;         /* True for one-pass algorithm without the FIFO */
  int hasFK;             /* True if foreign key processing is required */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;            /* True when updating a view (INSTEAD OF trigger) */
  Trigger *pTrigger;     /* List of triggers on pTab, if required */
  int tmask;             /* Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
#endif
  int newmask;           /* Mask of NEW.* columns accessed by BEFORE triggers */

  /* Register Allocations */
  int regRowCount = 0;   /* A count of rows changed */
  int regOldRowid;       /* The old rowid */
  int regNewRowid;       /* The new rowid */
  int regNew;            /* Content of the NEW.* table in triggers */
  int regOld = 0;        /* Content of OLD.* table in triggers */
  int regRowSet = 0;     /* Rowset of rows to be updated */

  memset(&sContext, 0, sizeof(sContext));
  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ){
    goto update_cleanup;
  }
  assert( pTabList->nSrc==1 );

  /* Locate the table which we want to update. 
  */
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 ) goto update_cleanup;
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);

  /* Figure out if we have any triggers and if the table being
  ** updated is a view.
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_UPDATE, pChanges, &tmask);
  isView = pTab->pSelect!=0;
  assert( pTrigger || tmask==0 );
#else
# define pTrigger 0
# define isView 0
# define tmask 0
#endif
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif

  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto update_cleanup;
  }
  if( sqlite3IsReadOnly(pParse, pTab, tmask) ){
    goto update_cleanup;
  }
  aXRef = sqlite3DbMallocRaw(db, sizeof(int) * pTab->nCol );
  if( aXRef==0 ) goto update_cleanup;
  for(i=0; i<pTab->nCol; i++) aXRef[i] = -1;

  /* Allocate a cursors for the main database table and for all indices.
  ** The index cursors might not be used, but if they are used they
  ** need to occur right after the database cursor.  So go ahead and
  ** allocate enough space, just in case.
  */
  pTabList->a[0].iCursor = iCur = pParse->nTab++;
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    pParse->nTab++;
  }

  /* Initialize the name-context */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;

  /* Resolve the column names in all the expressions of the
  ** of the UPDATE statement.  Also find the column index
  ** for each column to be updated in the pChanges array.  For each
  ** column to be updated, make sure we have authorization to change
  ** that column.
  */
  chngRowid = 0;
  for(i=0; i<pChanges->nExpr; i++){
    if( sqlite3ResolveExprNames(&sNC, pChanges->a[i].pExpr) ){
      goto update_cleanup;
    }
    for(j=0; j<pTab->nCol; j++){
      if( sqlite3StrICmp(pTab->aCol[j].zName, pChanges->a[i].zName)==0 ){
        if( j==pTab->iPKey ){
          chngRowid = 1;
          pRowidExpr = pChanges->a[i].pExpr;
        }
        aXRef[j] = i;
        break;
      }
    }
    if( j>=pTab->nCol ){
      if( sqlite3IsRowid(pChanges->a[i].zName) ){
        j = -1;
        chngRowid = 1;
        pRowidExpr = pChanges->a[i].pExpr;
      }else{
        sqlite3ErrorMsg(pParse, "no such column: %s", pChanges->a[i].zName);
        pParse->checkSchema = 1;
        goto update_cleanup;
      }
    }
#ifndef SQLITE_OMIT_AUTHORIZATION
    {
      int rc;
      rc = sqlite3AuthCheck(pParse, SQLITE_UPDATE, pTab->zName,
                            j<0 ? "ROWID" : pTab->aCol[j].zName,
                            db->aDb[iDb].zName);
      if( rc==SQLITE_DENY ){
        goto update_cleanup;
      }else if( rc==SQLITE_IGNORE ){
        aXRef[j] = -1;
      }
    }
#endif
  }

  hasFK = sqlite3FkRequired(pParse, pTab, aXRef, chngRowid);

  /* Allocate memory for the array aRegIdx[].  There is one entry in the
  ** array for each index associated with table being updated.  Fill in
  ** the value with a register number for indices that are to be used
  ** and with zero for unused indices.
  */
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){}
  if( nIdx>0 ){
    aRegIdx = sqlite3DbMallocRaw(db, sizeof(Index*) * nIdx );
    if( aRegIdx==0 ) goto update_cleanup;
  }
  for(j=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, j++){
    int reg;
    if( hasFK || chngRowid ){
      reg = ++pParse->nMem;
    }else{
      reg = 0;
      for(i=0; i<pIdx->nColumn; i++){
        if( aXRef[pIdx->aiColumn[i]]>=0 ){
          reg = ++pParse->nMem;
          break;
        }
      }
    }
    aRegIdx[j] = reg;
  }

  /* Begin generating code. */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ) goto update_cleanup;
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, 1, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Virtual tables must be handled separately */
  if( IsVirtual(pTab) ){
    updateVirtualTable(pParse, pTabList, pTab, pChanges, pRowidExpr, aXRef,
                       pWhere, onError);
    pWhere = 0;
    pTabList = 0;
    goto update_cleanup;
  }
#endif

  /* Allocate required registers. */
  regRowSet = ++pParse->nMem;
  regOldRowid = regNewRowid = ++pParse->nMem;
  if( pTrigger || hasFK ){
    regOld = pParse->nMem + 1;
    pParse->nMem += pTab->nCol;
  }
  if( chngRowid || pTrigger || hasFK ){
    regNewRowid = ++pParse->nMem;
  }
  regNew = pParse->nMem + 1;
  pParse->nMem += pTab->nCol;

  /* Start the view context. */
  if( isView ){
    sqlite3AuthContextPush(pParse, &sContext, pTab->zName);
  }

  /* If we are trying to update a view, realize that view into
  ** a ephemeral table.
  */
#if !defined(SQLITE_OMIT_VIEW) && !defined(SQLITE_OMIT_TRIGGER)
  if( isView ){
    sqlite3MaterializeView(pParse, pTab, pWhere, iCur);
  }
#endif

  /* Resolve the column names in all the expressions in the
  ** WHERE clause.
  */
  if( sqlite3ResolveExprNames(&sNC, pWhere) ){
    goto update_cleanup;
  }

  /* Begin the database scan
  */
  sqlite3VdbeAddOp3(v, OP_Null, 0, regRowSet, regOldRowid);
  pWInfo = sqlite3WhereBegin(
      pParse, pTabList, pWhere, 0, 0, WHERE_ONEPASS_DESIRED, 0
  );
  if( pWInfo==0 ) goto update_cleanup;
  okOnePass = pWInfo->okOnePass;

  /* Remember the rowid of every item to be updated.
  */
  sqlite3VdbeAddOp2(v, OP_Rowid, iCur, regOldRowid);
  if( !okOnePass ){
    sqlite3VdbeAddOp2(v, OP_RowSetAdd, regRowSet, regOldRowid);
  }

  /* End the database scan loop.
  */
  sqlite3WhereEnd(pWInfo);

  /* Initialize the count of updated rows
  */
  if( (db->flags & SQLITE_CountRows) && !pParse->pTriggerTab ){
    regRowCount = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regRowCount);
  }

  if( !isView ){
    /* 
    ** Open every index that needs updating.  Note that if any
    ** index could potentially invoke a REPLACE conflict resolution 
    ** action, then we need to open all indices because we might need
    ** to be deleting some records.
    */
    if( !okOnePass ) sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenWrite); 
    if( onError==OE_Replace ){
      openAll = 1;
    }else{
      openAll = 0;
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        if( pIdx->onError==OE_Replace ){
          openAll = 1;
          break;
        }
      }
    }
    for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
      assert( aRegIdx );
      if( openAll || aRegIdx[i]>0 ){
        KeyInfo *pKey = sqlite3IndexKeyinfo(pParse, pIdx);
        sqlite3VdbeAddOp4(v, OP_OpenWrite, iCur+i+1, pIdx->tnum, iDb,
                       (char*)pKey, P4_KEYINFO_HANDOFF);
        assert( pParse->nTab>iCur+i+1 );
      }
    }
  }

  /* Top of the update loop */
  if( okOnePass ){
    int a1 = sqlite3VdbeAddOp1(v, OP_NotNull, regOldRowid);
    addr = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, a1);
  }else{
    addr = sqlite3VdbeAddOp3(v, OP_RowSetRead, regRowSet, 0, regOldRowid);
  }

  /* Make cursor iCur point to the record that is being updated. If
  ** this record does not exist for some reason (deleted by a trigger,
  ** for example, then jump to the next iteration of the RowSet loop.  */
  sqlite3VdbeAddOp3(v, OP_NotExists, iCur, addr, regOldRowid);

  /* If the record number will change, set register regNewRowid to
  ** contain the new value. If the record number is not being modified,
  ** then regNewRowid is the same register as regOldRowid, which is
  ** already populated.  */
  assert( chngRowid || pTrigger || hasFK || regOldRowid==regNewRowid );
  if( chngRowid ){
    sqlite3ExprCode(pParse, pRowidExpr, regNewRowid);
    sqlite3VdbeAddOp1(v, OP_MustBeInt, regNewRowid);
  }

  /* If there are triggers on this table, populate an array of registers 
  ** with the required old.* column data.  */
  if( hasFK || pTrigger ){
    u32 oldmask = (hasFK ? sqlite3FkOldmask(pParse, pTab) : 0);
    oldmask |= sqlite3TriggerColmask(pParse, 
        pTrigger, pChanges, 0, TRIGGER_BEFORE|TRIGGER_AFTER, pTab, onError
    );
    for(i=0; i<pTab->nCol; i++){
      if( aXRef[i]<0 || oldmask==0xffffffff || (i<32 && (oldmask & (1<<i))) ){
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, i, regOld+i);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, regOld+i);
      }
    }
    if( chngRowid==0 ){
      sqlite3VdbeAddOp2(v, OP_Copy, regOldRowid, regNewRowid);
    }
  }

  /* Populate the array of registers beginning at regNew with the new
  ** row data. This array is used to check constaints, create the new
  ** table and index records, and as the values for any new.* references
  ** made by triggers.
  **
  ** If there are one or more BEFORE triggers, then do not populate the
  ** registers associated with columns that are (a) not modified by
  ** this UPDATE statement and (b) not accessed by new.* references. The
  ** values for registers not modified by the UPDATE must be reloaded from 
  ** the database after the BEFORE triggers are fired anyway (as the trigger 
  ** may have modified them). So not loading those that are not going to
  ** be used eliminates some redundant opcodes.
  */
  newmask = sqlite3TriggerColmask(
      pParse, pTrigger, pChanges, 1, TRIGGER_BEFORE, pTab, onError
  );
  sqlite3VdbeAddOp3(v, OP_Null, 0, regNew, regNew+pTab->nCol-1);
  for(i=0; i<pTab->nCol; i++){
    if( i==pTab->iPKey ){
      /*sqlite3VdbeAddOp2(v, OP_Null, 0, regNew+i);*/
    }else{
      j = aXRef[i];
      if( j>=0 ){
        sqlite3ExprCode(pParse, pChanges->a[j].pExpr, regNew+i);
      }else if( 0==(tmask&TRIGGER_BEFORE) || i>31 || (newmask&(1<<i)) ){
        /* This branch loads the value of a column that will not be changed 
        ** into a register. This is done if there are no BEFORE triggers, or
        ** if there are one or more BEFORE triggers that use this value via
        ** a new.* reference in a trigger program.
        */
        testcase( i==31 );
        testcase( i==32 );
        sqlite3VdbeAddOp3(v, OP_Column, iCur, i, regNew+i);
        sqlite3ColumnDefault(v, pTab, i, regNew+i);
      }
    }
  }

  /* Fire any BEFORE UPDATE triggers. This happens before constraints are
  ** verified. One could argue that this is wrong.
  */
  if( tmask&TRIGGER_BEFORE ){
    sqlite3VdbeAddOp2(v, OP_Affinity, regNew, pTab->nCol);
    sqlite3TableAffinityStr(v, pTab);
    sqlite3CodeRowTrigger(pParse, pTrigger, TK_UPDATE, pChanges, 
        TRIGGER_BEFORE, pTab, regOldRowid, onError, addr);

    /* The row-trigger may have deleted the row being updated. In this
    ** case, jump to the next row. No updates or AFTER triggers are 
    ** required. This behavior - what happens when the row being updated
    ** is deleted or renamed by a BEFORE trigger - is left undefined in the
    ** documentation.
    */
    sqlite3VdbeAddOp3(v, OP_NotExists, iCur, addr, regOldRowid);

    /* If it did not delete it, the row-trigger may still have modified 
    ** some of the columns of the row being updated. Load the values for 
    ** all columns not modified by the update statement into their 
    ** registers in case this has happened.
    */
    for(i=0; i<pTab->nCol; i++){
      if( aXRef[i]<0 && i!=pTab->iPKey ){
        sqlite3VdbeAddOp3(v, OP_Column, iCur, i, regNew+i);
        sqlite3ColumnDefault(v, pTab, i, regNew+i);
      }
    }
  }

  if( !isView ){
    int j1;                       /* Address of jump instruction */

    /* Do constraint checks. */
    sqlite3GenerateConstraintChecks(pParse, pTab, iCur, regNewRowid,
        aRegIdx, (chngRowid?regOldRowid:0), 1, onError, addr, 0);

    /* Do FK constraint checks. */
    if( hasFK ){
      sqlite3FkCheck(pParse, pTab, regOldRowid, 0);
    }

    /* Delete the index entries associated with the current record.  */
    j1 = sqlite3VdbeAddOp3(v, OP_NotExists, iCur, 0, regOldRowid);
    sqlite3GenerateRowIndexDelete(pParse, pTab, iCur, aRegIdx);
  
    /* If changing the record number, delete the old record.  */
    if( hasFK || chngRowid ){
      sqlite3VdbeAddOp2(v, OP_Delete, iCur, 0);
    }
    sqlite3VdbeJumpHere(v, j1);

    if( hasFK ){
      sqlite3FkCheck(pParse, pTab, 0, regNewRowid);
    }
  
    /* Insert the new index entries and the new record. */
    sqlite3CompleteInsertion(pParse, pTab, iCur, regNewRowid, aRegIdx, 1, 0, 0);

    /* Do any ON CASCADE, SET NULL or SET DEFAULT operations required to
    ** handle rows (possibly in other tables) that refer via a foreign key
    ** to the row just updated. */ 
    if( hasFK ){
      sqlite3FkActions(pParse, pTab, pChanges, regOldRowid);
    }
  }

  /* Increment the row counter 
  */
  if( (db->flags & SQLITE_CountRows) && !pParse->pTriggerTab){
    sqlite3VdbeAddOp2(v, OP_AddImm, regRowCount, 1);
  }

  sqlite3CodeRowTrigger(pParse, pTrigger, TK_UPDATE, pChanges, 
      TRIGGER_AFTER, pTab, regOldRowid, onError, addr);

  /* Repeat the above with the next record to be updated, until
  ** all record selected by the WHERE clause have been updated.
  */
  sqlite3VdbeAddOp2(v, OP_Goto, 0, addr);
  sqlite3VdbeJumpHere(v, addr);

  /* Close all tables */
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    assert( aRegIdx );
    if( openAll || aRegIdx[i]>0 ){
      sqlite3VdbeAddOp2(v, OP_Close, iCur+i+1, 0);
    }
  }
  sqlite3VdbeAddOp2(v, OP_Close, iCur, 0);

  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /*
  ** Return the number of rows that were changed. If this routine is 
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( (db->flags&SQLITE_CountRows) && !pParse->pTriggerTab && !pParse->nested ){
    sqlite3VdbeAddOp2(v, OP_ResultRow, regRowCount, 1);
    sqlite3VdbeSetNumCols(v, 1);
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, "rows updated", SQLITE_STATIC);
  }

update_cleanup:
  sqlite3AuthContextPop(&sContext);
  sqlite3DbFree(db, aRegIdx);
  sqlite3DbFree(db, aXRef);
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprListDelete(db, pChanges);
  sqlite3ExprDelete(db, pWhere);
  return;
}